

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O0

btVector3 operator*(btVector3 *v1,btVector3 *v2)

{
  float *in_RSI;
  float *in_RDI;
  float local_2c;
  float local_28;
  float local_24 [5];
  btVector3 local_10;
  
  local_24[0] = *in_RDI * *in_RSI;
  local_28 = in_RDI[1] * in_RSI[1];
  local_2c = in_RDI[2] * in_RSI[2];
  btVector3::btVector3(&local_10,local_24,&local_28,&local_2c);
  return (btVector3)local_10.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator*(const btVector3& v1, const btVector3& v2)
{
#if defined(BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	return btVector3(_mm_mul_ps(v1.mVec128, v2.mVec128));
#elif defined(BT_USE_NEON)
	return btVector3(vmulq_f32(v1.mVec128, v2.mVec128));
#else
	return btVector3(
			v1.m_floats[0] * v2.m_floats[0],
			v1.m_floats[1] * v2.m_floats[1],
			v1.m_floats[2] * v2.m_floats[2]);
#endif
}